

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

CappedArray<char,_14UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_14UL> *__return_storage_ptr__,Stringifier *this,uint i)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint u;
  uint8_t reverse [13];
  
  reverse[8] = '\0';
  reverse[9] = '\0';
  reverse[10] = '\0';
  reverse[0xb] = '\0';
  reverse[0xc] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[7] = '\0';
  if (i == 0) {
    puVar2 = reverse + 1;
  }
  else {
    puVar2 = reverse;
    for (; i != 0; i = i / 10) {
      *puVar2 = (uint8_t)(i % 10);
      puVar2 = puVar2 + 1;
    }
  }
  sVar1 = 0;
  for (; reverse < puVar2; puVar2 = puVar2 + -1) {
    __return_storage_ptr__->content[sVar1] = puVar2[-1] + '0';
    sVar1 = sVar1 + 1;
  }
  __return_storage_ptr__->currentSize = sVar1;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  // Note that if `i` is the most-negative value, negating it produces the same bit value. But
  // since it's a signed integer, this is considered an overflow. We therefore must make it
  // unsigned first, then negate it, to avoid ubsan complaining.
  Unsigned u = i;
  if (negative) u = -u;
  uint8_t reverse[sizeof(T) * 3 + 1]{};
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}